

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::OptConstFoldUnary
          (GlobOpt *this,Instr **pInstr,int32 intConstantValue,bool isUsingOriginalSrc1Value,
          Value **pDstVal)

{
  OpCode OVar1;
  GlobOpt *dst;
  StackSym *pSVar2;
  Opnd *this_00;
  uint uVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  bool bVar7;
  BailOutKind BVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  Instr *pIVar12;
  IntConstOpnd *newSrc;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  Value *pVVar15;
  undefined1 *puVar16;
  char *this_01;
  bool bVar17;
  double local_48;
  
  bVar5 = DoConstFold(this);
  if (!bVar5) {
    return false;
  }
  pIVar12 = *pInstr;
  if (pIVar12->m_dst != (Opnd *)0x0) {
    OVar6 = IR::Opnd::GetKind(pIVar12->m_dst);
    if (OVar6 != OpndKindReg) {
      return false;
    }
    pIVar12 = *pInstr;
  }
  OVar1 = pIVar12->m_opcode;
  bVar5 = false;
  if (OVar1 < ToVar) {
    switch(OVar1) {
    case Incr_A:
      uVar3 = intConstantValue + 1;
      if (SCARRY4(intConstantValue,1)) {
        return false;
      }
      break;
    case Decr_A:
      uVar3 = intConstantValue - 1;
      if (SBORROW4(intConstantValue,1)) {
        return false;
      }
      break;
    case Neg_A:
      if ((intConstantValue & 0x7fffffffU) == 0) {
        return false;
      }
      uVar3 = -intConstantValue;
      break;
    case Not_A:
      uVar3 = ~intConstantValue;
      break;
    default:
      if (OVar1 != Conv_Num) {
        if (OVar1 != Ld_A) {
          return false;
        }
        if ((pIVar12->field_0x38 & 0x10) != 0) {
          BVar8 = IR::Instr::GetBailOutKind(pIVar12);
          if (BVar8 == BailOutExpectingString) {
            puVar16 = (undefined1 *)__cxa_allocate_exception(1);
            *puVar16 = 0x23;
            __cxa_throw(puVar16,&Js::RejitException::typeinfo,0);
          }
          BVar8 = IR::Instr::GetBailOutKind(*pInstr);
          if (BVar8 != BailOutExpectingInteger) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar11 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                               ,0x1c2d,"(instr->GetBailOutKind() == IR::BailOutExpectingInteger)",
                               "instr->GetBailOutKind() == IR::BailOutExpectingInteger");
            if (!bVar5) goto LAB_00455d6d;
            *puVar11 = 0;
          }
          IR::Instr::ClearBailOutInfo(*pInstr);
        }
      }
LAB_00455501:
      bVar17 = !isUsingOriginalSrc1Value;
      bVar5 = true;
      local_48 = 0.0;
      goto LAB_0045572f;
    }
    goto LAB_00455720;
  }
  switch(OVar1) {
  case InlineMathAcos:
    local_48 = Js::Math::Acos((double)intConstantValue);
    break;
  case InlineMathAsin:
    local_48 = Js::Math::Asin((double)intConstantValue);
    break;
  case InlineMathAtan:
    local_48 = Js::Math::Atan((double)intConstantValue);
    break;
  case InlineMathAtan2:
  case InlineMathPow:
  case Clz:
  case InlineMathMax:
  case InlineMathImul:
  case InlineMathMin:
  case InlineMathRandom:
    goto switchD_0045540d_caseD_252;
  case InlineMathCos:
    local_48 = Js::Math::Cos((double)intConstantValue);
    break;
  case InlineMathExp:
    local_48 = Js::Math::Exp((double)intConstantValue);
    break;
  case InlineMathLog:
    local_48 = Js::Math::Log((double)intConstantValue);
    break;
  case InlineMathSin:
    local_48 = Js::Math::Sin((double)intConstantValue);
    break;
  case InlineMathSqrt:
    local_48 = (double)intConstantValue;
    if (local_48 < 0.0) {
      local_48 = sqrt(local_48);
    }
    else {
      local_48 = SQRT(local_48);
    }
    break;
  case InlineMathTan:
    local_48 = tan((double)intConstantValue);
    break;
  case InlineMathAbs:
    uVar3 = intConstantValue;
    if (intConstantValue < 1) {
      uVar3 = -intConstantValue;
    }
    goto LAB_00455720;
  case InlineMathClz:
    if (intConstantValue == 0) {
      intConstantValue = 0x20;
    }
    else {
      uVar3 = 0x1f;
      if (intConstantValue != 0) {
        for (; (uint)intConstantValue >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      intConstantValue = uVar3 ^ 0x1f;
    }
    goto switchD_0045540d_caseD_25e;
  case Ctz:
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    bVar5 = JITTimeFunctionBody::IsWasmFunction(pJVar13);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1ca3,"(func->GetJITFunctionBody()->IsWasmFunction())",
                         "func->GetJITFunctionBody()->IsWasmFunction()");
      if (!bVar5) goto LAB_00455d6d;
      *puVar11 = 0;
    }
    if (((*pInstr)->field_0x38 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x1ca4,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
      if (!bVar5) goto LAB_00455d6d;
      *puVar11 = 0;
    }
    if (intConstantValue == 0) {
      uVar3 = 0x20;
    }
    else {
      uVar3 = 0;
      if (intConstantValue != 0) {
        for (; ((uint)intConstantValue >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
    }
    goto LAB_00455720;
  case InlineMathCeil:
  case InlineMathFloor:
  case InlineMathRound:
    goto switchD_0045540d_caseD_25e;
  case InlineMathFround:
    local_48 = (double)intConstantValue;
    break;
  default:
    if (OVar1 != ToVar) {
      if (OVar1 != LdC_A_I4) {
        return false;
      }
      goto LAB_00455501;
    }
    goto switchD_0045540d_caseD_25e;
  }
  bVar17 = true;
  intConstantValue = 0;
  bVar5 = false;
LAB_0045572f:
  CaptureByteCodeSymUses(this,*pInstr);
  if (((*pInstr)->field_0x38 & 0x10) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ccf,"(!instr->HasBailOutInfo())","!instr->HasBailOutInfo()");
    if (!bVar7) goto LAB_00455d6d;
    *puVar11 = 0;
  }
  if (bVar5) {
    pIVar12 = *pInstr;
LAB_004557e5:
    newSrc = IR::IntConstOpnd::New((long)intConstantValue,TyInt32,pIVar12->m_func,false);
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar9,uVar10);
    bVar5 = true;
    if (bVar7) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Constant folding to %d\n",(ulong)(uint)intConstantValue);
      bVar5 = true;
LAB_004558b5:
      Output::Flush();
    }
  }
  else {
    intConstantValue = (int32)local_48;
    pIVar12 = *pInstr;
    if ((local_48 == (double)(int)local_48) && (!NAN(local_48) && !NAN((double)(int)local_48)))
    goto LAB_004557e5;
    newSrc = (IntConstOpnd *)IR::FloatConstOpnd::New(local_48,TyFloat64,pIVar12->m_func);
    pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    uVar9 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
    pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    uVar10 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar9,uVar10);
    if (bVar5) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      bVar5 = false;
      Output::Print(L": ");
      Output::Print(L"Constant folding to %f\n",local_48._0_4_);
      goto LAB_004558b5;
    }
    bVar5 = false;
  }
  IR::Instr::ReplaceSrc1(*pInstr,&newSrc->super_Opnd);
  OptSrc(this,&newSrc->super_Opnd,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
  dst = (GlobOpt *)(*pInstr)->m_dst;
  OVar6 = IR::Opnd::GetKind((Opnd *)dst);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1ce8,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
    if (!bVar7) goto LAB_00455d6d;
    *puVar11 = 0;
  }
  OVar6 = IR::Opnd::GetKind((Opnd *)dst);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar7) goto LAB_00455d6d;
    *puVar11 = 0;
  }
  if (bVar5) {
    pSVar2 = (StackSym *)dst->intConstantToStackSymMap;
    if (((pSVar2->field_0x18 & 1) != 0) && ((pSVar2->field_5).m_instrDef != (Instr *)0x0)) {
      StackSym::SetIsIntConst(pSVar2,(long)intConstantValue);
    }
    if (bVar17) {
      pVVar15 = GetIntConstantValue(this,intConstantValue,*pInstr,(Opnd *)dst);
      *pDstVal = pVVar15;
    }
    bVar5 = IsTypeSpecPhaseOff(this->func);
    pIVar12 = *pInstr;
    if (bVar5) {
      pIVar12->m_opcode = LdC_A_I4;
LAB_00455a5e:
      this_01 = (char *)dst;
      OVar6 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        this_01 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_00455d6d:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar11 = 0;
      }
      ToVarStackSym((GlobOpt *)this_01,(StackSym *)dst->intConstantToStackSymMap,this->currentBlock)
      ;
    }
    else {
      pIVar12->m_opcode = Ld_I4;
      OVar6 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_00455d6d;
        *puVar11 = 0;
      }
      ToInt32Dst(this,pIVar12,(RegOpnd *)dst,this->currentBlock);
      this_00 = (*pInstr)->m_dst;
      OVar6 = IR::Opnd::GetKind(this_00);
      if (OVar6 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_00455d6d;
        *puVar11 = 0;
      }
      pSVar2 = (StackSym *)this_00[1]._vptr_Opnd;
      if (((pSVar2->field_0x18 & 1) != 0) && ((pSVar2->field_5).m_instrDef != (Instr *)0x0)) {
        StackSym::SetIsIntConst(pSVar2,(long)intConstantValue);
      }
    }
  }
  else {
    pVVar15 = NewFloatConstantValue(this,local_48,(Opnd *)dst);
    *pDstVal = pVVar15;
    bVar5 = IsTypeSpecPhaseOff(this->func);
    pIVar12 = *pInstr;
    if (bVar5) {
      pIVar12->m_opcode = LdC_A_R8;
      goto LAB_00455a5e;
    }
    pIVar12->m_opcode = LdC_F8_R8;
    OVar6 = IR::Opnd::GetKind((Opnd *)dst);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_00455d6d;
      *puVar11 = 0;
    }
    ToFloat64Dst(this,pIVar12,(RegOpnd *)dst,this->currentBlock);
  }
  InvalidateInductionVariables(this,*pInstr);
  bVar5 = true;
switchD_0045540d_caseD_252:
  return bVar5;
switchD_0045540d_caseD_25e:
  IR::Instr::ClearBailOutInfo(pIVar12);
  uVar3 = intConstantValue;
LAB_00455720:
  intConstantValue = uVar3;
  local_48 = 0.0;
  bVar17 = true;
  bVar5 = true;
  goto LAB_0045572f;
}

Assistant:

bool
GlobOpt::OptConstFoldUnary(
    IR::Instr * *pInstr,
    const int32 intConstantValue,
    const bool isUsingOriginalSrc1Value,
    Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    int32 value = 0;
    IR::Opnd *constOpnd;
    bool isInt = true;
    bool doSetDstVal = true;
    FloatConstType fValue = 0.0;

    if (!DoConstFold())
    {
        return false;
    }

    if (instr->GetDst() && !instr->GetDst()->IsRegOpnd())
    {
        return false;
    }

    switch(instr->m_opcode)
    {
    case Js::OpCode::Neg_A:
        if (intConstantValue == 0)
        {
            // Could fold to -0.0
            return false;
        }

        if (Int32Math::Neg(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Not_A:
        Int32Math::Not(intConstantValue, &value);
        break;

    case Js::OpCode::Ld_A:
        if (instr->HasBailOutInfo())
        {
            //The profile data for switch expr can be string and in GlobOpt we realize it is an int.
            if(instr->GetBailOutKind() == IR::BailOutExpectingString)
            {
                throw Js::RejitException(RejitReason::DisableSwitchOptExpectingString);
            }
            Assert(instr->GetBailOutKind() == IR::BailOutExpectingInteger);
            instr->ClearBailOutInfo();
        }
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Conv_Num:
    case Js::OpCode::LdC_A_I4:
        value = intConstantValue;
        if(isUsingOriginalSrc1Value)
        {
            doSetDstVal = false;  // Let OptDst do it by copying src1Val
        }
        break;

    case Js::OpCode::Incr_A:
        if (Int32Math::Inc(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::Decr_A:
        if (Int32Math::Dec(intConstantValue, &value))
        {
            return false;
        }
        break;

    case Js::OpCode::InlineMathAcos:
        fValue = Js::Math::Acos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAsin:
        fValue = Js::Math::Asin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathAtan:
        fValue = Js::Math::Atan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathCos:
        fValue = Js::Math::Cos((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathExp:
        fValue = Js::Math::Exp((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathLog:
        fValue = Js::Math::Log((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSin:
        fValue = Js::Math::Sin((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathSqrt:
        fValue = ::sqrt((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathTan:
        fValue = ::tan((double)intConstantValue);
        isInt = false;
        break;

    case Js::OpCode::InlineMathFround:
        fValue = (double) (float) intConstantValue;
        isInt = false;
        break;

    case Js::OpCode::InlineMathAbs:
        if (intConstantValue == INT32_MIN)
        {
            if (instr->GetDst()->IsInt32())
            {
                // if dst is an int (e.g. in asm.js), we should coerce it, not convert to float
                value = static_cast<int32>(2147483648U);
            }
            else
            {
                // Rejit with AggressiveIntTypeSpecDisabled for Math.abs(INT32_MIN) because it causes dst
                // to be float type which could be different with previous type spec result in LoopPrePass
                throw Js::RejitException(RejitReason::AggressiveIntTypeSpecDisabled);
            }
        }
        else
        {
            value = ::abs(intConstantValue);
        }
        break;

    case Js::OpCode::InlineMathClz:
        DWORD clz;
        if (_BitScanReverse(&clz, intConstantValue))
        {
            value = 31 - clz;
        }
        else
        {
            value = 32;
        }
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::Ctz:
        Assert(func->GetJITFunctionBody()->IsWasmFunction());
        Assert(!instr->HasBailOutInfo());
        DWORD ctz;
        if (_BitScanForward(&ctz, intConstantValue))
        {
            value = ctz;
        }
        else
        {
            value = 32;
        }
        break;

    case Js::OpCode::InlineMathFloor:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathCeil:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;

    case Js::OpCode::InlineMathRound:
        value = intConstantValue;
        instr->ClearBailOutInfo();
        break;
    case Js::OpCode::ToVar:
        if (Js::TaggedInt::IsOverflow(intConstantValue))
        {
            return false;
        }
        else
        {
            value = intConstantValue;
            instr->ClearBailOutInfo();
            break;
        }
    default:
        return false;
    }

    this->CaptureByteCodeSymUses(instr);

    Assert(!instr->HasBailOutInfo()); // If we are, in fact, successful in constant folding the instruction, there is no point in having the bailoutinfo around anymore.
                                      // Make sure that it is cleared if it was initially present.
    if (!isInt)
    {
        value = (int32)fValue;
        if (fValue == (double)value)
        {
            isInt = true;
        }
    }
    if (isInt)
    {
        constOpnd = IR::IntConstOpnd::New(value, TyInt32, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %d\n"), value);
    }
    else
    {
        constOpnd = IR::FloatConstOpnd::New(fValue, TyFloat64, instr->m_func);
        GOPT_TRACE(_u("Constant folding to %f\n"), fValue);
    }
    instr->ReplaceSrc1(constOpnd);

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    Assert(dst->IsRegOpnd());

    StackSym *dstSym = dst->AsRegOpnd()->m_sym;

    if (isInt)
    {
        if (dstSym->IsSingleDef())
        {
            dstSym->SetIsIntConst(value);
        }

        if (doSetDstVal)
        {
            *pDstVal = GetIntConstantValue(value, instr, dst);
        }

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_I4;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::Ld_I4;
            this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);

            StackSym * currDstSym = instr->GetDst()->AsRegOpnd()->m_sym;
            if (currDstSym->IsSingleDef())
            {
                currDstSym->SetIsIntConst(value);
            }
        }
    }
    else
    {
        *pDstVal = NewFloatConstantValue(fValue, dst);

        if (IsTypeSpecPhaseOff(this->func))
        {
            instr->m_opcode = Js::OpCode::LdC_A_R8;
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        else
        {
            instr->m_opcode = Js::OpCode::LdC_F8_R8;
            this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
        }
    }

    InvalidateInductionVariables(instr);

    return true;
}